

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O3

EVP_MD * EVP_get_digestbyname(char *name)

{
  char *__s1;
  int iVar1;
  long lVar2;
  EVP_MD *pEVar3;
  
  lVar2 = 0x18;
  do {
    __s1 = *(char **)((long)&nid_to_digest_mapping[0].nid + lVar2);
    if (*(char **)(&UNK_00433e68 + lVar2) != (char *)0x0) {
      iVar1 = strcmp(*(char **)(&UNK_00433e68 + lVar2),name);
      if (iVar1 == 0) goto LAB_0028301d;
    }
    if (__s1 != (char *)0x0) {
      iVar1 = strcmp(__s1,name);
      if (iVar1 == 0) {
LAB_0028301d:
        pEVar3 = (EVP_MD *)(**(code **)((long)&PTR_anon_var_dwarf_606167_00433e60 + lVar2))();
        return pEVar3;
      }
    }
    lVar2 = lVar2 + 0x20;
    if (lVar2 == 600) {
      return (EVP_MD *)0x0;
    }
  } while( true );
}

Assistant:

const EVP_MD *EVP_get_digestbyname(const char *name) {
  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(nid_to_digest_mapping); i++) {
    const char *short_name = nid_to_digest_mapping[i].short_name;
    const char *long_name = nid_to_digest_mapping[i].long_name;
    if ((short_name && strcmp(short_name, name) == 0) ||
        (long_name && strcmp(long_name, name) == 0)) {
      return nid_to_digest_mapping[i].md_func();
    }
  }

  return NULL;
}